

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_scope.h
# Opt level: O1

void __thiscall t_scope::resolve_const_value(t_scope *this,t_const_value *const_val,t_type *ttype)

{
  double dVar1;
  long lVar2;
  pointer pcVar3;
  mapped_type ptVar4;
  t_const_value *ptVar5;
  mapped_type ptVar6;
  int iVar7;
  t_const_value_type tVar8;
  _Rb_tree_node_base *p_Var9;
  t_field *ptVar10;
  _Base_ptr p_Var11;
  mapped_type *pptVar12;
  t_type *ptVar13;
  int64_t iVar14;
  undefined4 extraout_var;
  mapped_type *pptVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  long *plVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar18;
  _func_int **pp_Var19;
  size_type *psVar20;
  pointer pptVar21;
  _Rb_tree_header *p_Var22;
  _func_int *p_Var23;
  ostringstream valstm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  _Rb_tree_node_base *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  key_type local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar7 == '\0') {
    iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar7 == '\0') {
      iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar7 == '\0') {
        iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
        if ((char)iVar7 == '\0') {
          tVar8 = t_const_value::get_type(const_val);
          iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
          if (tVar8 == CV_IDENTIFIER) {
            if ((char)iVar7 == '\0') {
              pcVar3 = (const_val->identifierVal_)._M_dataplus._M_p;
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c8,pcVar3,
                         pcVar3 + (const_val->identifierVal_)._M_string_length);
              pptVar12 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_const_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_const_*>_>_>
                         ::operator[](&this->constants_,&local_1c8);
              ptVar4 = *pptVar12;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p);
              }
              if (ptVar4 == (mapped_type)0x0) {
                pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __cxa_allocate_exception(0x20);
                local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
                pcVar3 = (const_val->identifierVal_)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_290,pcVar3,
                           pcVar3 + (const_val->identifierVal_)._M_string_length);
                std::operator+(local_1a8,"No enum value or constant found named \"",&local_290);
                std::operator+(pbVar16,local_1a8,"\"!");
                __cxa_throw(pbVar16,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
              ptVar13 = t_type::get_true_type(ptVar4->type_);
              iVar7 = (*(ptVar13->super_t_doc)._vptr_t_doc[5])(ptVar13);
              if ((char)iVar7 != '\0') {
                switch(*(undefined4 *)&ptVar13[1].super_t_doc._vptr_t_doc) {
                case 0:
                  puVar18 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar18 = "Constants cannot be of type VOID";
                  __cxa_throw(puVar18,&char_const*::typeinfo,0);
                case 1:
                  goto switchD_00373598_caseD_1;
                case 2:
                case 3:
                case 4:
                case 5:
                case 6:
                  iVar14 = t_const_value::get_integer(ptVar4->value_);
                  const_val->valType_ = CV_INTEGER;
                  const_val->intVal_ = iVar14;
                  return;
                case 7:
                  dVar1 = ptVar4->value_->doubleVal_;
                  const_val->valType_ = CV_DOUBLE;
                  const_val->doubleVal_ = dVar1;
                  return;
                default:
                  return;
                }
              }
              iVar7 = (*(ptVar13->super_t_doc)._vptr_t_doc[0x10])(ptVar13);
              if ((char)iVar7 != '\0') {
                ptVar5 = ptVar4->value_;
                const_val->valType_ = CV_MAP;
                p_Var11 = (ptVar5->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                p_Var22 = &(ptVar5->mapVal_)._M_t._M_impl.super__Rb_tree_header;
                if ((_Rb_tree_header *)p_Var11 == p_Var22) {
                  return;
                }
                do {
                  local_1a8[0]._M_dataplus._M_p = *(pointer *)(p_Var11 + 1);
                  ptVar6 = (mapped_type)p_Var11[1]._M_parent;
                  pptVar15 = std::
                             map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                             ::operator[](&const_val->mapVal_,(key_type *)local_1a8);
                  *pptVar15 = ptVar6;
                  p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
                } while ((_Rb_tree_header *)p_Var11 != p_Var22);
                return;
              }
              iVar7 = (*(ptVar13->super_t_doc)._vptr_t_doc[0xe])(ptVar13);
              if ((char)iVar7 == '\0') {
                return;
              }
              ptVar5 = ptVar4->value_;
              const_val->valType_ = CV_LIST;
              for (pptVar21 = (ptVar5->listVal_).
                              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                  pptVar21 !=
                  (ptVar5->listVal_).
                  super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                  super__Vector_impl_data._M_finish; pptVar21 = pptVar21 + 1) {
                t_const_value::add_list(const_val,*pptVar21);
              }
              return;
            }
          }
          else {
            if ((char)iVar7 == '\0') {
              return;
            }
            iVar14 = t_const_value::get_integer(const_val);
            for (pp_Var19 = ttype[1].super_t_doc._vptr_t_doc;
                pp_Var19 != (_func_int **)ttype[1].super_t_doc.doc_._M_dataplus._M_p;
                pp_Var19 = pp_Var19 + 1) {
              p_Var23 = *pp_Var19;
              if (iVar14 == *(int *)(p_Var23 + 0x80)) goto LAB_003735f1;
            }
            p_Var23 = (_func_int *)0x0;
LAB_003735f1:
            if (p_Var23 == (_func_int *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              t_const_value::get_integer(const_val);
              std::ostream::_M_insert<long>((long)local_1a8);
              pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
              std::operator+(&local_248,"Couldn\'t find a named value in enum ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_01,iVar7));
              plVar17 = (long *)std::__cxx11::string::append((char *)&local_248);
              local_290._M_dataplus._M_p = (pointer)*plVar17;
              psVar20 = (size_type *)(plVar17 + 2);
              if ((size_type *)local_290._M_dataplus._M_p == psVar20) {
                local_290.field_2._M_allocated_capacity = *psVar20;
                local_290.field_2._8_8_ = plVar17[3];
                local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
              }
              else {
                local_290.field_2._M_allocated_capacity = *psVar20;
              }
              local_290._M_string_length = plVar17[1];
              *plVar17 = (long)psVar20;
              plVar17[1] = 0;
              *(undefined1 *)(plVar17 + 2) = 0;
              std::__cxx11::stringbuf::str();
              std::operator+(pbVar16,&local_290,&local_268);
              __cxa_throw(pbVar16,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
            std::operator+(local_1a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var,iVar7),".");
            std::operator+(&local_208,local_1a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var23 + 0x60));
            const_val->valType_ = CV_IDENTIFIER;
            std::__cxx11::string::_M_assign((string *)&const_val->identifierVal_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p);
            }
          }
          const_val->enum_ = (t_enum *)ttype;
        }
        else {
          p_Var11 = (const_val->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_270 = &(const_val->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
          if (p_Var11 != local_270) {
            do {
              lVar2 = *(long *)(*(long *)(p_Var11 + 1) + 0x48);
              local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_228,lVar2,*(long *)(*(long *)(p_Var11 + 1) + 0x50) + lVar2
                        );
              ptVar10 = t_struct::get_field_by_name((t_struct *)ttype,&local_228);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._M_dataplus._M_p != &local_228.field_2) {
                operator_delete(local_228._M_dataplus._M_p);
              }
              if (ptVar10 == (t_field *)0x0) {
                pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __cxa_allocate_exception(0x20);
                local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
                lVar2 = *(long *)(*(long *)(p_Var11 + 1) + 0x48);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_268,lVar2,
                           *(long *)(*(long *)(p_Var11 + 1) + 0x50) + lVar2);
                std::operator+(&local_248,"No field named \"",&local_268);
                plVar17 = (long *)std::__cxx11::string::append((char *)&local_248);
                local_290._M_dataplus._M_p = (pointer)*plVar17;
                psVar20 = (size_type *)(plVar17 + 2);
                if ((size_type *)local_290._M_dataplus._M_p == psVar20) {
                  local_290.field_2._M_allocated_capacity = *psVar20;
                  local_290.field_2._8_8_ = plVar17[3];
                  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
                }
                else {
                  local_290.field_2._M_allocated_capacity = *psVar20;
                }
                local_290._M_string_length = plVar17[1];
                *plVar17 = (long)psVar20;
                plVar17[1] = 0;
                *(undefined1 *)(plVar17 + 2) = 0;
                iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
                std::operator+(local_1a8,&local_290,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(extraout_var_00,iVar7));
                std::operator+(pbVar16,local_1a8,"\"");
                __cxa_throw(pbVar16,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
              resolve_const_value(this,(t_const_value *)p_Var11[1]._M_parent,ptVar10->type_);
              p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
            } while (p_Var11 != local_270);
          }
        }
      }
      else {
        for (pptVar21 = (const_val->listVal_).
                        super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            pptVar21 !=
            (const_val->listVal_).
            super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar21 = pptVar21 + 1) {
          resolve_const_value(this,*pptVar21,*(t_type **)&ttype[1].super_t_doc.has_doc_);
        }
      }
    }
    else {
      for (pptVar21 = (const_val->listVal_).
                      super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          pptVar21 !=
          (const_val->listVal_).
          super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar21 = pptVar21 + 1) {
        resolve_const_value(this,*pptVar21,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      }
    }
  }
  else {
    for (p_Var9 = (const_val->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(const_val->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      resolve_const_value(this,*(t_const_value **)(p_Var9 + 1),
                          *(t_type **)&ttype[1].super_t_doc.has_doc_);
      resolve_const_value(this,(t_const_value *)p_Var9[1]._M_parent,
                          *(t_type **)&ttype[1].annotations_._M_t._M_impl);
    }
  }
  return;
switchD_00373598_caseD_1:
  pcVar3 = (ptVar4->value_->stringVal_)._M_dataplus._M_p;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,pcVar3,pcVar3 + (ptVar4->value_->stringVal_)._M_string_length);
  const_val->valType_ = CV_STRING;
  std::__cxx11::string::_M_assign((string *)&const_val->stringVal_);
  if (local_1e8[0] == local_1d8) {
    return;
  }
  operator_delete(local_1e8[0]);
  return;
}

Assistant:

void resolve_const_value(t_const_value* const_val, t_type* ttype) {
    if (ttype->is_map()) {
      const std::map<t_const_value*, t_const_value*, t_const_value::value_compare>& map = const_val->get_map();
      std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
      for (v_iter = map.begin(); v_iter != map.end(); ++v_iter) {
        resolve_const_value(v_iter->first, ((t_map*)ttype)->get_key_type());
        resolve_const_value(v_iter->second, ((t_map*)ttype)->get_val_type());
      }
    } else if (ttype->is_list()) {
      const std::vector<t_const_value*>& val = const_val->get_list();
      std::vector<t_const_value*>::const_iterator v_iter;
      for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
        resolve_const_value((*v_iter), ((t_list*)ttype)->get_elem_type());
      }
    } else if (ttype->is_set()) {
      const std::vector<t_const_value*>& val = const_val->get_list();
      std::vector<t_const_value*>::const_iterator v_iter;
      for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
        resolve_const_value((*v_iter), ((t_set*)ttype)->get_elem_type());
      }
    } else if (ttype->is_struct()) {
      auto* tstruct = (t_struct*)ttype;
      const std::map<t_const_value*, t_const_value*, t_const_value::value_compare>& map = const_val->get_map();
      std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
      for (v_iter = map.begin(); v_iter != map.end(); ++v_iter) {
        t_field* field = tstruct->get_field_by_name(v_iter->first->get_string());
        if (field == nullptr) {
          throw "No field named \"" + v_iter->first->get_string()
              + "\" was found in struct of type \"" + tstruct->get_name() + "\"";
        }
        resolve_const_value(v_iter->second, field->get_type());
      }
    } else if (const_val->get_type() == t_const_value::CV_IDENTIFIER) {
      if (ttype->is_enum()) {
        const_val->set_enum((t_enum*)ttype);
      } else {
        t_const* constant = get_constant(const_val->get_identifier());
        if (constant == nullptr) {
          throw "No enum value or constant found named \"" + const_val->get_identifier() + "\"!";
        }

        // Resolve typedefs to the underlying type
        t_type* const_type = constant->get_type()->get_true_type();

        if (const_type->is_base_type()) {
          switch (((t_base_type*)const_type)->get_base()) {
          case t_base_type::TYPE_I16:
          case t_base_type::TYPE_I32:
          case t_base_type::TYPE_I64:
          case t_base_type::TYPE_BOOL:
          case t_base_type::TYPE_I8:
            const_val->set_integer(constant->get_value()->get_integer());
            break;
          case t_base_type::TYPE_STRING:
            const_val->set_string(constant->get_value()->get_string());
            break;
          case t_base_type::TYPE_DOUBLE:
            const_val->set_double(constant->get_value()->get_double());
            break;
          case t_base_type::TYPE_VOID:
            throw "Constants cannot be of type VOID";
          }
        } else if (const_type->is_map()) {
          const std::map<t_const_value*, t_const_value*, t_const_value::value_compare>& map = constant->get_value()->get_map();
          std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

          const_val->set_map();
          for (v_iter = map.begin(); v_iter != map.end(); ++v_iter) {
            const_val->add_map(v_iter->first, v_iter->second);
          }
        } else if (const_type->is_list()) {
          const std::vector<t_const_value*>& val = constant->get_value()->get_list();
          std::vector<t_const_value*>::const_iterator v_iter;

          const_val->set_list();
          for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
            const_val->add_list(*v_iter);
          }
        }
      }
    } else if (ttype->is_enum()) {
      // enum constant with non-identifier value. set the enum and find the
      // value's name.
      auto* tenum = (t_enum*)ttype;
      t_enum_value* enum_value = tenum->get_constant_by_value(const_val->get_integer());
      if (enum_value == nullptr) {
        std::ostringstream valstm;
        valstm << const_val->get_integer();
        throw "Couldn't find a named value in enum " + tenum->get_name() + " for value "
            + valstm.str();
      }
      const_val->set_identifier(tenum->get_name() + "." + enum_value->get_name());
      const_val->set_enum(tenum);
    }
  }